

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

bool __thiscall ON_Xform::IsAffine(ON_Xform *this)

{
  double *pdVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined4 in_EAX;
  int iVar4;
  ulong uVar5;
  
  auVar3._4_4_ = -(uint)(this->m_xform[3][1] != 0.0);
  auVar3._0_4_ = -(uint)(this->m_xform[3][0] != 0.0);
  auVar3._8_4_ = -(uint)(this->m_xform[3][2] != 0.0);
  auVar3._12_4_ = -(uint)(this->m_xform[3][3] != 1.0);
  iVar4 = movmskps(in_EAX,auVar3);
  if (iVar4 != 0) {
    return false;
  }
  uVar5 = 0;
  do {
    bVar2 = 0x7f < uVar5;
    if (0x7f < uVar5) {
      return bVar2;
    }
    pdVar1 = (double *)((long)this->m_xform[0] + uVar5);
    uVar5 = uVar5 + 8;
  } while (ABS(*pdVar1) < 1.23432101234321e+308);
  return bVar2;
}

Assistant:

bool ON_Xform::IsAffine() const
{
  return (
    0.0 == m_xform[3][0] 
    && 0.0 == m_xform[3][1] 
    && 0.0 == m_xform[3][2] 
    && 1.0 == m_xform[3][3] 
    && IsValid());
}